

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O2

void Super_WriteLibraryGateName_rec(Super_Gate_t_conflict *pGate,char *pBuffer)

{
  char *__src;
  size_t sVar1;
  ulong uVar2;
  char Buffer [10];
  char local_22 [10];
  
  if (pGate->pRoot == (Mio_Gate_t *)0x0) {
    local_22[0] = pGate->field_0x9 + 'a';
    local_22[1] = 0;
    strcat(pBuffer,local_22);
  }
  else {
    __src = Mio_GateReadName(pGate->pRoot);
    strcat(pBuffer,__src);
    sVar1 = strlen(pBuffer);
    (pBuffer + sVar1)[0] = '(';
    (pBuffer + sVar1)[1] = '\0';
    for (uVar2 = 0; uVar2 < (*(uint *)&pGate->field_0x8 >> 2 & 0x3f); uVar2 = uVar2 + 1) {
      if (uVar2 != 0) {
        sVar1 = strlen(pBuffer);
        (pBuffer + sVar1)[0] = ',';
        (pBuffer + sVar1)[1] = '\0';
      }
      Super_WriteLibraryGateName_rec(pGate->pFanins[uVar2],pBuffer);
    }
    sVar1 = strlen(pBuffer);
    (pBuffer + sVar1)[0] = ')';
    (pBuffer + sVar1)[1] = '\0';
  }
  return;
}

Assistant:

void Super_WriteLibraryGateName_rec( Super_Gate_t * pGate, char * pBuffer )
{
    char Buffer[10];
    int i;

    if ( pGate->pRoot == NULL )
    {
        sprintf( Buffer, "%c", 'a' + pGate->Number );
        strcat( pBuffer, Buffer );
        return;
    }
    strcat( pBuffer, Mio_GateReadName(pGate->pRoot) );
    strcat( pBuffer, "(" );
    for ( i = 0; i < (int)pGate->nFanins; i++ )
    {
        if ( i )
            strcat( pBuffer, "," );
        Super_WriteLibraryGateName_rec( pGate->pFanins[i], pBuffer );
    }
    strcat( pBuffer, ")" );
}